

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void Internal_GrowNgon(ON_MeshTopology *top,uchar *emarks,uchar *fmarks,uchar etest_mask,
                      uchar etest_result,uchar ftest_mask,uchar ftest_result,uchar merged_mark,
                      ON_SimpleArray<unsigned_int> *ngon_fi)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint local_64;
  uint local_60;
  uint local_5c;
  int f1i;
  int efi;
  ON_MeshTopologyEdge *e;
  int local_48;
  int ei;
  int fei;
  int f0_ecount;
  ON_MeshTopologyFace *f0;
  int local_30;
  int f0i;
  int nfi_1;
  int nfi;
  int face_count;
  uchar ftest_mask_local;
  uchar etest_result_local;
  uchar etest_mask_local;
  uchar *fmarks_local;
  uchar *emarks_local;
  ON_MeshTopology *top_local;
  
  nfi._1_1_ = ftest_mask;
  nfi._2_1_ = etest_result;
  nfi._3_1_ = etest_mask;
  _face_count = fmarks;
  fmarks_local = emarks;
  emarks_local = (uchar *)top;
  iVar3 = ON_SimpleArray<unsigned_int>::Count(ngon_fi);
  if (0 < iVar3) {
    nfi_1 = ON_SimpleArray<ON_MeshTopologyFace>::Count
                      ((ON_SimpleArray<ON_MeshTopologyFace> *)(emarks_local + 0x50));
    for (f0i = 0; iVar3 = f0i, iVar4 = ON_SimpleArray<unsigned_int>::Count(ngon_fi),
        puVar1 = _face_count, iVar3 < iVar4; f0i = f0i + 1) {
      puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,f0i);
      puVar1[*puVar5] = puVar1[*puVar5] | merged_mark;
    }
    nfi._3_1_ = nfi._3_1_ | merged_mark;
    nfi._2_1_ = nfi._2_1_ & (merged_mark ^ 0xff);
    nfi._1_1_ = nfi._1_1_ | merged_mark;
    for (local_30 = 0; iVar3 = local_30, iVar4 = ON_SimpleArray<unsigned_int>::Count(ngon_fi),
        iVar3 < iVar4; local_30 = local_30 + 1) {
      puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,local_30);
      f0._4_4_ = *puVar5;
      _fei = ON_SimpleArray<ON_MeshTopologyFace>::operator[]
                       ((ON_SimpleArray<ON_MeshTopologyFace> *)(emarks_local + 0x50),f0._4_4_);
      bVar2 = ON_MeshTopologyFace::IsTriangle(_fei);
      ei = 4;
      if (bVar2) {
        ei = 3;
      }
      for (local_48 = 0; local_48 < ei; local_48 = local_48 + 1) {
        iVar3 = _fei->m_topei[local_48];
        e._4_4_ = iVar3;
        if (((-1 < iVar3) &&
            (iVar4 = ON_SimpleArray<ON_MeshTopologyEdge>::Count
                               ((ON_SimpleArray<ON_MeshTopologyEdge> *)(emarks_local + 0x38)),
            iVar3 <= iVar4)) && (nfi._2_1_ == (fmarks_local[e._4_4_] & nfi._3_1_))) {
          fmarks_local[e._4_4_] = fmarks_local[e._4_4_] | merged_mark;
          _f1i = ON_SimpleArray<ON_MeshTopologyEdge>::operator[]
                           ((ON_SimpleArray<ON_MeshTopologyEdge> *)(emarks_local + 0x38),e._4_4_);
          if ((_f1i->m_topf_count == 2) && (_f1i->m_topfi != (int *)0x0)) {
            local_5c = (uint)(f0._4_4_ == *_f1i->m_topfi);
            local_60 = _f1i->m_topfi[(int)local_5c];
            if ((-1 < (int)local_60) &&
               (((int)local_60 < nfi_1 &&
                ((ftest_result & (merged_mark ^ 0xff)) == (_face_count[(int)local_60] & nfi._1_1_)))
               )) {
              _face_count[(int)local_60] = _face_count[(int)local_60] | merged_mark;
              local_64 = local_60;
              ON_SimpleArray<unsigned_int>::Append(ngon_fi,&local_64);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void Internal_GrowNgon(
  const ON_MeshTopology& top,
  unsigned char* emarks,
  unsigned char* fmarks,
  unsigned char etest_mask,
  unsigned char etest_result,
  unsigned char ftest_mask,
  unsigned char ftest_result,
  const unsigned char merged_mark,
  ON_SimpleArray<unsigned>& ngon_fi
)
{
  if (ngon_fi.Count() <= 0)
    return;

  const int face_count = top.m_topf.Count();

  for (int nfi = 0; nfi < ngon_fi.Count(); ++nfi)
    fmarks[ngon_fi[nfi]] |= merged_mark;

  etest_mask |= merged_mark;
  etest_result &= ~merged_mark;

  ftest_mask |= merged_mark;
  ftest_result &= ~merged_mark;

  for (int nfi = 0; nfi < ngon_fi.Count(); ++nfi)
  {
    const int f0i = ngon_fi[nfi];
    const ON_MeshTopologyFace& f0 = top.m_topf[f0i];
    const int f0_ecount = f0.IsTriangle() ? 3 : 4;
    for (int fei = 0; fei < f0_ecount; ++fei)
    {
      const int ei = f0.m_topei[fei];
      if (ei < 0 || ei > top.m_tope.Count())
        continue;
      if (etest_result != (emarks[ei] & etest_mask))
        continue;
      emarks[ei] |= merged_mark;
      const ON_MeshTopologyEdge& e = top.m_tope[ei];
      if (2 != e.m_topf_count || nullptr == e.m_topfi)
        continue;
      const int efi = (f0i != e.m_topfi[0]) ? 0 : 1;
      const int f1i = e.m_topfi[efi];
      if (f1i < 0 || f1i >= face_count)
        continue;
      if (ftest_result != (fmarks[f1i] & ftest_mask))
        continue;
      fmarks[f1i] |= merged_mark;
      ngon_fi.Append(f1i);
    }
  }
}